

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_is_float(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pObj;
  anon_union_8_3_18420de5_for_x aVar1;
  
  if (nArg < 1) {
    aVar1.rVal = 0.0;
  }
  else {
    aVar1._0_4_ = (uint)(*apArg)->iFlags >> 2 & 1;
    aVar1.iVal._4_4_ = 0;
  }
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  pObj->x = aVar1;
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Builtin_is_float(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	int res = 0; /* Assume false by default */
	if( nArg > 0 ){
		res = jx9_value_is_float(apArg[0]);
	}
	/* Query result */
	jx9_result_bool(pCtx, res);
	return JX9_OK;
}